

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::TaskThread::addQueue(TaskThread *this,Queue *queue)

{
  bool bVar1;
  value_type local_60 [3];
  unique_lock<std::mutex> local_48;
  native_handle_type local_38;
  id local_30;
  undefined1 local_28 [8];
  unique_lock<std::mutex> l;
  Queue *queue_local;
  TaskThread *this_local;
  
  l._8_8_ = queue;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28);
  local_30 = std::this_thread::get_id();
  local_38 = (native_handle_type)std::thread::get_id(&this->thread);
  bVar1 = std::operator!=(local_30,(id)local_38);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock(&local_48,&this->queueLock);
    std::unique_lock<std::mutex>::operator=((unique_lock<std::mutex> *)local_28,&local_48);
    std::unique_lock<std::mutex>::~unique_lock(&local_48);
  }
  local_60[0] = (value_type)l._8_8_;
  std::vector<soul::TaskThread::Queue_*,_std::allocator<soul::TaskThread::Queue_*>_>::push_back
            (&this->queues,local_60);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return;
}

Assistant:

void addQueue (Queue& queue)
    {
        std::unique_lock<std::mutex> l;

        if (std::this_thread::get_id() != thread.get_id())
            l = std::unique_lock<std::mutex> (queueLock);

        queues.push_back (std::addressof (queue));
    }